

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chnsecal.cpp
# Opt level: O0

int32_t __thiscall icu_63::ChineseCalendar::newYear(ChineseCalendar *this,int32_t gyear)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int32_t newMoon11;
  int32_t newMoon2;
  int32_t newMoon1;
  int32_t solsticeAfter;
  int32_t solsticeBefore;
  int32_t cacheValue;
  UErrorCode status;
  int32_t gyear_local;
  ChineseCalendar *this_local;
  
  solsticeBefore = 0;
  cacheValue = gyear;
  _status = this;
  solsticeAfter = CalendarCache::get(&gChineseCalendarNewYearCache,gyear,&solsticeBefore);
  if (solsticeAfter == 0) {
    iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])
                      (this,(ulong)(cacheValue - 1));
    iVar3 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x32])
                      (this,(ulong)(uint)cacheValue);
    uVar4 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)(iVar2 + 1),this,1);
    solsticeAfter =
         (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                   ((double)(int)(uVar4 + 0x19),this,1);
    uVar5 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])((double)(iVar3 + 1),this,0);
    iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x34])
                      (this,(ulong)uVar4,(ulong)uVar5);
    if ((iVar2 == 0xc) &&
       ((iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x36])(this,(ulong)uVar4),
        (char)iVar2 != '\0' ||
        (iVar2 = (*(this->super_Calendar).super_UObject._vptr_UObject[0x36])
                           (this,(ulong)(uint)solsticeAfter), (char)iVar2 != '\0')))) {
      solsticeAfter =
           (*(this->super_Calendar).super_UObject._vptr_UObject[0x33])
                     ((double)(int)(solsticeAfter + 0x19),this,1);
    }
    CalendarCache::put(&gChineseCalendarNewYearCache,cacheValue,solsticeAfter,&solsticeBefore);
  }
  UVar1 = ::U_FAILURE(solsticeBefore);
  if (UVar1 != '\0') {
    solsticeAfter = 0;
  }
  return solsticeAfter;
}

Assistant:

int32_t ChineseCalendar::newYear(int32_t gyear) const {
    UErrorCode status = U_ZERO_ERROR;
    int32_t cacheValue = CalendarCache::get(&gChineseCalendarNewYearCache, gyear, status);

    if (cacheValue == 0) {

        int32_t solsticeBefore= winterSolstice(gyear - 1);
        int32_t solsticeAfter = winterSolstice(gyear);
        int32_t newMoon1 = newMoonNear(solsticeBefore + 1, TRUE);
        int32_t newMoon2 = newMoonNear(newMoon1 + SYNODIC_GAP, TRUE);
        int32_t newMoon11 = newMoonNear(solsticeAfter + 1, FALSE);
        
        if (synodicMonthsBetween(newMoon1, newMoon11) == 12 &&
            (hasNoMajorSolarTerm(newMoon1) || hasNoMajorSolarTerm(newMoon2))) {
            cacheValue = newMoonNear(newMoon2 + SYNODIC_GAP, TRUE);
        } else {
            cacheValue = newMoon2;
        }

        CalendarCache::put(&gChineseCalendarNewYearCache, gyear, cacheValue, status);
    }
    if(U_FAILURE(status)) {
        cacheValue = 0;
    }
    return cacheValue;
}